

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O3

int Vec_PtrPushUnique(Vec_Ptr_t *p,void *Entry)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  ulong uVar4;
  size_t __size;
  
  uVar1 = p->nSize;
  if (0 < (int)uVar1) {
    ppvVar3 = p->pArray;
    uVar4 = 0;
    do {
      if (ppvVar3[uVar4] == Entry) goto LAB_00799465;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(p->pArray,0x80);
      }
      p->pArray = ppvVar3;
      p->nCap = 0x10;
    }
    else {
      __size = (ulong)uVar1 << 4;
      if (p->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(p->pArray,__size);
      }
      p->pArray = ppvVar3;
      p->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar3 = p->pArray;
  }
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  ppvVar3[iVar2] = Entry;
LAB_00799465:
  return (int)ppvVar3;
}

Assistant:

static inline int Vec_PtrPushUnique( Vec_Ptr_t * p, void * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_PtrPush( p, Entry );
    return 0;
}